

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicRMW
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicRMW *curr)

{
  byte bVar1;
  Name memoryName;
  Name memory;
  Name memoryName_00;
  undefined1 this_00 [8];
  Address memorySize;
  Literal *pLVar2;
  Address addr;
  undefined1 local_168 [8];
  Flow ptr;
  Flow value;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  Literal loaded;
  Literal computed;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_168,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_168);
    goto LAB_00788db7;
  }
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&ptr.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
  if (value.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_90,this,(Name)(curr->memory).super_IString.str);
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory);
    this_00 = local_90;
    pLVar2 = Flow::getSingleValue((Flow *)local_168);
    Literal::Literal((Literal *)&value.breakTo.super_IString.str._M_str,pLVar2);
    addr = getFinalAddress<wasm::AtomicRMW>
                     ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                      (Literal *)&value.breakTo.super_IString.str._M_str,memorySize);
    Literal::~Literal((Literal *)&value.breakTo.super_IString.str._M_str);
    memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memoryName.super_IString.str._M_len = (size_t)info.instance;
    doAtomicLoad((Literal *)&info.name.super_IString.str._M_str,
                 (ModuleRunnerBase<wasm::ModuleRunner> *)local_90,addr,(uint)curr->bytes,
                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                       type.id,memoryName,memorySize);
    pLVar2 = Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
    Literal::Literal((Literal *)&loaded.type,pLVar2);
    switch(curr->op) {
    case RMWAdd:
      Literal::add((Literal *)&computed.type,(Literal *)&info.name.super_IString.str._M_str,
                   (Literal *)&loaded.type);
      Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWSub:
      Literal::sub((Literal *)&computed.type,(Literal *)&info.name.super_IString.str._M_str,
                   (Literal *)&loaded.type);
      Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWAnd:
      Literal::and_((Literal *)&computed.type,(Literal *)&info.name.super_IString.str._M_str,
                    (Literal *)&loaded.type);
      Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWOr:
      Literal::or_((Literal *)&computed.type,(Literal *)&info.name.super_IString.str._M_str,
                   (Literal *)&loaded.type);
      Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWXor:
      Literal::xor_((Literal *)&computed.type,(Literal *)&info.name.super_IString.str._M_str,
                    (Literal *)&loaded.type);
      Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    default:
      goto switchD_00788c7c_default;
    }
    Literal::~Literal((Literal *)&computed.type);
switchD_00788c7c_default:
    bVar1 = curr->bytes;
    Literal::Literal(&local_c0,(Literal *)&loaded.type);
    memoryName_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memoryName_00.super_IString.str._M_len = (size_t)info.instance;
    doAtomicStore((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,addr,(uint)bVar1,&local_c0,
                  memoryName_00,memorySize);
    Literal::~Literal(&local_c0);
    Literal::Literal(&local_a8,(Literal *)&info.name.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a8);
    Literal::~Literal(&local_a8);
    Literal::~Literal((Literal *)&loaded.type);
    Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
LAB_00788db7:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_168);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicRMW(AtomicRMW* curr) {
    NOTE_ENTER("AtomicRMW");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    auto value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    NOTE_EVAL1(ptr);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    NOTE_EVAL1(addr);
    NOTE_EVAL1(value);
    auto loaded = info.instance->doAtomicLoad(
      addr, curr->bytes, curr->type, info.name, memorySize);
    NOTE_EVAL1(loaded);
    auto computed = value.getSingleValue();
    switch (curr->op) {
      case RMWAdd:
        computed = loaded.add(computed);
        break;
      case RMWSub:
        computed = loaded.sub(computed);
        break;
      case RMWAnd:
        computed = loaded.and_(computed);
        break;
      case RMWOr:
        computed = loaded.or_(computed);
        break;
      case RMWXor:
        computed = loaded.xor_(computed);
        break;
      case RMWXchg:
        break;
    }
    info.instance->doAtomicStore(
      addr, curr->bytes, computed, info.name, memorySize);
    return loaded;
  }